

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

Index __thiscall
wasm::anon_unknown_22::Array2Struct::getArrayNewSize(Array2Struct *this,Expression *allocation)

{
  ArrayNew *pAVar1;
  ArrayNewFixed *pAVar2;
  size_t sVar3;
  ArrayNewFixed *arrayNewFixed;
  ArrayNew *arrayNew;
  Expression *allocation_local;
  Array2Struct *this_local;
  
  pAVar1 = Expression::dynCast<wasm::ArrayNew>(allocation);
  if (pAVar1 == (ArrayNew *)0x0) {
    pAVar2 = Expression::dynCast<wasm::ArrayNewFixed>(allocation);
    if (pAVar2 == (ArrayNewFixed *)0x0) {
      handle_unreachable("bad allocation",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                         ,0x4f1);
    }
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(pAVar2->values).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    this_local._4_4_ = (Index)sVar3;
  }
  else {
    this_local._4_4_ = getIndex(this,pAVar1->size);
  }
  return this_local._4_4_;
}

Assistant:

Index getArrayNewSize(Expression* allocation) {
    if (auto* arrayNew = allocation->dynCast<ArrayNew>()) {
      return getIndex(arrayNew->size);
    } else if (auto* arrayNewFixed = allocation->dynCast<ArrayNewFixed>()) {
      return arrayNewFixed->values.size();
    } else {
      WASM_UNREACHABLE("bad allocation");
    }
  }